

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write<char,fmt::v9::appender>(appender out,char *value)

{
  basic_string_view<char> value_00;
  appender aVar1;
  char *in_RSI;
  size_t in_RDI;
  char *in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffffe8;
  
  if (in_RSI == (char *)0x0) {
    throw_format_error(in_stack_ffffffffffffffc0);
  }
  std::char_traits<char>::length((char_type *)0x1d16cc);
  value_00.size_ = in_RDI;
  value_00.data_ = in_RSI;
  aVar1 = write<char,fmt::v9::appender>((appender)in_stack_ffffffffffffffe8.container,value_00);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}